

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

int countint(TValue *key,int *nums)

{
  double dVar1;
  int iVar2;
  
  if (key->tt == 3) {
    dVar1 = (key->value).n;
    if (((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) &&
       ((int)dVar1 - 1U < 0x4000000)) {
      iVar2 = luaO_log2((int)dVar1 - 1U);
      nums[(long)iVar2 + 1] = nums[(long)iVar2 + 1] + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}